

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTest.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  PathTest *this;
  int test_id;
  TestRunner runner;
  TestRunner local_41;
  TestSuite local_40;
  
  TestRunner::TestRunner(&local_41,*argv);
  local_40._vptr_TestSuite = (_func_int **)&PTR__TestSuite_00108d80;
  local_40.mTestCases.mAllocated = 0x20;
  local_40.mTestCases.mData = (TestCase **)operator_new__(0x100);
  local_40.mTestCases.mSize = 0;
  test_id = 1;
  do {
    this = (PathTest *)
           operator_new(0x128,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/PathTest.cpp"
                        ,0x174);
    PathTest::PathTest(this,test_id);
    if (local_40.mTestCases.mSize == local_40.mTestCases.mAllocated) {
      JetHead::vector<TestCase_*>::sizeup(&local_40.mTestCases,0);
    }
    local_40.mTestCases.mData[local_40.mTestCases.mSize] = (TestCase *)this;
    local_40.mTestCases.mSize = local_40.mTestCases.mSize + 1;
    test_id = test_id + 1;
  } while (test_id != 10);
  TestRunner::RunAll(&local_41,&local_40);
  TestSuite::~TestSuite(&local_40);
  return 0;
}

Assistant:

int main( int argc, char* argv[] )
{
	TestRunner runner( argv[ 0 ] );
	TestSuite ts;
	
	for ( int i = 0; i < PathTest::gNumberOfTests; i++ )
	{
		ts.AddTestCase( jh_new PathTest( i + 1 ) );
	}
	
	runner.RunAll( ts );
	
	return 0;
}